

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void wasm::populateTryTableSentTypes(TryTable *curr,Module *wasm)

{
  char *pcVar1;
  Name name;
  bool bVar2;
  size_t sVar3;
  Name *pNVar4;
  Tag *this;
  Type *pTVar5;
  bool *pbVar6;
  Iterator IVar7;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar8;
  Type local_b8;
  value_type local_b0;
  Type t;
  Iterator __end3;
  Iterator __begin3;
  Type local_68;
  Type *local_60;
  Type *__range3;
  vector<wasm::Type,_std::allocator<wasm::Type>_> sentType;
  Name tagName;
  HeapType HStack_28;
  Index i;
  Type local_20;
  Type exnref;
  Module *wasm_local;
  TryTable *curr_local;
  
  if (wasm != (Module *)0x0) {
    exnref.id = (uintptr_t)wasm;
    ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::clear
              (&(curr->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>);
    HeapType::HeapType(&stack0xffffffffffffffd8,exn);
    Type::Type(&local_20,HStack_28,NonNullable,Inexact);
    for (tagName.super_IString.str._M_str._4_4_ = 0;
        sVar3 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::size
                          (&(curr->catchTags).
                            super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>),
        tagName.super_IString.str._M_str._4_4_ < sVar3;
        tagName.super_IString.str._M_str._4_4_ = tagName.super_IString.str._M_str._4_4_ + 1) {
      pNVar4 = ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>::operator[]
                         (&(curr->catchTags).
                           super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>,
                          (ulong)tagName.super_IString.str._M_str._4_4_);
      sentType.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(pNVar4->super_IString).str._M_len;
      pcVar1 = (pNVar4->super_IString).str._M_str;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
      bVar2 = IString::operator_cast_to_bool
                        ((IString *)
                         &sentType.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        name.super_IString.str._M_str = pcVar1;
        name.super_IString.str._M_len =
             (size_t)sentType.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        this = Module::getTag((Module *)exnref.id,name);
        local_68 = Tag::params(this);
        local_60 = &local_68;
        IVar7 = Type::begin(local_60);
        __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
             (size_t)IVar7.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                     parent;
        PVar8 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end(local_60);
        while( true ) {
          __end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)PVar8.index;
          t.id = (uintptr_t)PVar8.parent;
          bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                            ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                             &__end3.
                              super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                              index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *
                                    )&t);
          if (!bVar2) break;
          pTVar5 = Type::Iterator::operator*
                             ((Iterator *)
                              &__end3.
                               super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               index);
          local_b0.id = pTVar5->id;
          std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                    ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_b0);
          ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                    ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                     &__end3.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
          PVar8.index = (size_t)__end3.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                                parent;
          PVar8.parent = (Type *)t.id;
        }
      }
      pbVar6 = ArenaVectorBase<ArenaVector<bool>,_bool>::operator[]
                         (&(curr->catchRefs).super_ArenaVectorBase<ArenaVector<bool>,_bool>,
                          (ulong)tagName.super_IString.str._M_str._4_4_);
      if ((*pbVar6 & 1U) != 0) {
        std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                  ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3,&local_20);
      }
      bVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::empty
                        ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
      if (bVar2) {
        Type::Type(&local_b8,none);
      }
      else {
        Type::Type(&local_b8,(Tuple *)&__range3);
      }
      ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>::push_back
                (&(curr->sentTypes).super_ArenaVectorBase<ArenaVector<wasm::Type>,_wasm::Type>,
                 local_b8);
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&__range3);
    }
  }
  return;
}

Assistant:

static void populateTryTableSentTypes(TryTable* curr, Module* wasm) {
  if (!wasm) {
    return;
  }
  curr->sentTypes.clear();
  // We always use the refined non-nullable type in our IR, which is what the
  // wasm spec defines when GC is enabled (=== non-nullable types are allowed).
  // If GC is not enabled then we emit a nullable type in the binary format in
  // WasmBinaryWriter::writeType.
  // TODO: Make this exact.
  Type exnref = Type(HeapType::exn, NonNullable);
  for (Index i = 0; i < curr->catchTags.size(); i++) {
    auto tagName = curr->catchTags[i];
    std::vector<Type> sentType;
    if (tagName) {
      for (auto t : wasm->getTag(tagName)->params()) {
        sentType.push_back(t);
      }
    }
    if (curr->catchRefs[i]) {
      sentType.push_back(exnref);
    }
    curr->sentTypes.push_back(sentType.empty() ? Type::none : Type(sentType));
  }
}